

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::add_sample
          (TypedTimeSamples<tinyusdz::Visibility> *this,double t,Visibility *v)

{
  pointer *ppSVar1;
  iterator __position;
  ulong uVar2;
  undefined4 uVar3;
  Sample s;
  Sample local_18;
  
  uVar3 = local_18._12_4_;
  local_18._12_4_ = local_18._12_4_ & 0xffffff00;
  local_18.value = *v;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>>
                *)this,__position,&local_18);
  }
  else {
    uVar2 = CONCAT44(uVar3,local_18.value) & 0xffffff00ffffffff;
    (__position._M_current)->t = t;
    (__position._M_current)->value = (int)uVar2;
    (__position._M_current)->blocked = (bool)(char)(uVar2 >> 0x20);
    *(int3 *)&(__position._M_current)->field_0xd = (int3)(uVar2 >> 0x28);
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }